

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcessOutput.cxx
# Opt level: O0

bool __thiscall
cmProcessOutput::DecodeText
          (cmProcessOutput *this,vector<char,_std::allocator<char>_> *raw,
          vector<char,_std::allocator<char>_> *decoded,size_t id)

{
  byte bVar1;
  bool bVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  allocator<char> local_81;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_80;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_78;
  string local_70;
  byte local_49;
  undefined1 local_48 [7];
  bool success;
  string str;
  size_t id_local;
  vector<char,_std::allocator<char>_> *decoded_local;
  vector<char,_std::allocator<char>_> *raw_local;
  cmProcessOutput *this_local;
  
  str.field_2._8_8_ = id;
  std::__cxx11::string::string((string *)local_48);
  local_78._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(raw);
  local_80._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(raw);
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
            ((string *)&local_70,local_78,local_80,&local_81);
  bVar2 = DecodeText(this,&local_70,(string *)local_48,str.field_2._8_8_);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_81);
  local_49 = bVar2;
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  std::vector<char,std::allocator<char>>::
  assign<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<char,std::allocator<char>> *)decoded,__first,__last);
  bVar1 = local_49;
  std::__cxx11::string::~string((string *)local_48);
  return (bool)(bVar1 & 1);
}

Assistant:

bool cmProcessOutput::DecodeText(std::vector<char> raw,
                                 std::vector<char>& decoded, size_t id)
{
  std::string str;
  const bool success =
    this->DecodeText(std::string(raw.begin(), raw.end()), str, id);
  decoded.assign(str.begin(), str.end());
  return success;
}